

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

CTypeID lj_ctype_getname(CTState *cts,CType **ctp,GCstr *name,uint32_t tmask)

{
  CType *pCVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar3 = (uint)name + 0xfb3ee249;
  uVar5 = (uVar3 ^ (uint)name) - (uVar3 * 0x4000 | uVar3 >> 0x12);
  uVar4 = (ulong)((uVar3 >> 0xd ^ uVar5) - (uVar5 >> 0x13) & 0x7f);
  uVar3 = (uint)cts->hash[uVar4];
  do {
    if (uVar3 == 0) {
      *ctp = cts->tab;
      return 0;
    }
    pCVar1 = cts->tab + uVar3;
    if (((GCstr *)(pCVar1->name).gcptr64 == name) && ((tmask >> (pCVar1->info >> 0x1c) & 1) != 0)) {
      *ctp = pCVar1;
      bVar2 = false;
      uVar4 = (ulong)uVar3;
    }
    else {
      uVar3 = (uint)pCVar1->next;
      bVar2 = true;
    }
  } while (bVar2);
  return (CTypeID)uVar4;
}

Assistant:

CTypeID lj_ctype_getname(CTState *cts, CType **ctp, GCstr *name, uint32_t tmask)
{
  CTypeID id = cts->hash[ct_hashname(name)];
  while (id) {
    CType *ct = ctype_get(cts, id);
    if (gcref(ct->name) == obj2gco(name) &&
	((tmask >> ctype_type(ct->info)) & 1)) {
      *ctp = ct;
      return id;
    }
    id = ct->next;
  }
  *ctp = &cts->tab[0];  /* Simplify caller logic. ctype_get() would assert. */
  return 0;
}